

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::FirstMatchAssertionExpr::serializeTo
          (FirstMatchAssertionExpr *this,ASTSerializer *serializer)

{
  ASTSerializer *this_00;
  iterator ppEVar1;
  Expression *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  FirstMatchAssertionExpr *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"seq");
  ASTSerializer::write(serializer,(int)local_28._M_len,local_28._M_str,(size_t)this->seq);
  this_00 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"matchItems");
  ASTSerializer::startArray(this_00,___range2);
  __end2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
           begin(&this->matchItems);
  ppEVar1 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
            end(&this->matchItems);
  for (; __end2 != ppEVar1; __end2 = __end2 + 1) {
    ASTSerializer::serialize(local_18,*__end2);
  }
  ASTSerializer::endArray(local_18);
  return;
}

Assistant:

void FirstMatchAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("seq", seq);

    serializer.startArray("matchItems");
    for (auto item : matchItems)
        serializer.serialize(*item);
    serializer.endArray();
}